

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall
leveldb::_Test_RecoverDuringMemtableCompaction::_Run(_Test_RecoverDuringMemtableCompaction *this)

{
  string *k;
  bool bVar1;
  allocator local_29a;
  allocator local_299;
  string local_298;
  undefined1 local_278 [48];
  undefined1 local_248 [24];
  Tester local_230;
  Options options;
  
  k = (string *)(local_278 + 0x20);
  local_248._16_8_ = this;
  do {
    DBTest::CurrentOptions(&options,&this->super_DBTest);
    options.env = (Env *)(this->super_DBTest).env_;
    options.write_buffer_size = 1000000;
    DBTest::Reopen(&this->super_DBTest,&options);
    test::Tester::Tester
              (&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f0);
    std::__cxx11::string::string((string *)&local_298,"foo",&local_299);
    std::__cxx11::string::string((string *)k,"v1",&local_29a);
    this = (_Test_RecoverDuringMemtableCompaction *)local_248._16_8_;
    DBTest::Put((DBTest *)local_278,(string *)local_248._16_8_,&local_298);
    test::Tester::IsOk(&local_230,(Status *)local_278);
    Status::~Status((Status *)local_278);
    std::__cxx11::string::~string((string *)k);
    std::__cxx11::string::~string((string *)&local_298);
    test::Tester::~Tester(&local_230);
    test::Tester::Tester
              (&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f1);
    std::__cxx11::string::string((string *)&local_298,"big1",&local_299);
    local_278._32_8_ = local_248;
    std::__cxx11::string::_M_construct((ulong)k,-0x80);
    DBTest::Put((DBTest *)local_278,(string *)this,&local_298);
    test::Tester::IsOk(&local_230,(Status *)local_278);
    Status::~Status((Status *)local_278);
    std::__cxx11::string::~string((string *)k);
    std::__cxx11::string::~string((string *)&local_298);
    test::Tester::~Tester(&local_230);
    test::Tester::Tester
              (&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f2);
    std::__cxx11::string::string((string *)&local_298,"big2",&local_299);
    local_278._32_8_ = local_248;
    std::__cxx11::string::_M_construct((ulong)k,-0x18);
    DBTest::Put((DBTest *)local_278,(string *)this,&local_298);
    test::Tester::IsOk(&local_230,(Status *)local_278);
    Status::~Status((Status *)local_278);
    std::__cxx11::string::~string((string *)k);
    std::__cxx11::string::~string((string *)&local_298);
    test::Tester::~Tester(&local_230);
    test::Tester::Tester
              (&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f3);
    std::__cxx11::string::string((string *)&local_298,"bar",&local_299);
    std::__cxx11::string::string((string *)k,"v2",&local_29a);
    DBTest::Put((DBTest *)local_278,(string *)this,&local_298);
    test::Tester::IsOk(&local_230,(Status *)local_278);
    Status::~Status((Status *)local_278);
    std::__cxx11::string::~string((string *)k);
    std::__cxx11::string::~string((string *)&local_298);
    test::Tester::~Tester(&local_230);
    DBTest::Reopen(&this->super_DBTest,&options);
    test::Tester::Tester
              (&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f6);
    std::__cxx11::string::string((string *)k,"foo",(allocator *)local_278);
    DBTest::Get(&local_298,&this->super_DBTest,k,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_230,(char (*) [3])"v1",&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)k);
    test::Tester::~Tester(&local_230);
    test::Tester::Tester
              (&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f7);
    std::__cxx11::string::string((string *)k,"bar",(allocator *)local_278);
    DBTest::Get(&local_298,&this->super_DBTest,k,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_230,(char (*) [3])"v2",&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)k);
    test::Tester::~Tester(&local_230);
    test::Tester::Tester
              (&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f8);
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_298,-0x80);
    std::__cxx11::string::string((string *)local_278,"big1",&local_299);
    DBTest::Get(k,&this->super_DBTest,(string *)local_278,(Snapshot *)0x0);
    test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_230,&local_298,k);
    std::__cxx11::string::~string((string *)k);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::~string((string *)&local_298);
    test::Tester::~Tester(&local_230);
    test::Tester::Tester
              (&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3f9);
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_298,-0x18);
    std::__cxx11::string::string((string *)local_278,"big2",&local_299);
    DBTest::Get(k,&this->super_DBTest,(string *)local_278,(Snapshot *)0x0);
    test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_230,&local_298,k);
    std::__cxx11::string::~string((string *)k);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::~string((string *)&local_298);
    test::Tester::~Tester(&local_230);
    bVar1 = DBTest::ChangeOptions(&this->super_DBTest);
  } while (bVar1);
  return;
}

Assistant:

TEST(DBTest, RecoverDuringMemtableCompaction) {
  do {
    Options options = CurrentOptions();
    options.env = env_;
    options.write_buffer_size = 1000000;
    Reopen(&options);

    // Trigger a long memtable compaction and reopen the database during it
    ASSERT_OK(Put("foo", "v1"));                         // Goes to 1st log file
    ASSERT_OK(Put("big1", std::string(10000000, 'x')));  // Fills memtable
    ASSERT_OK(Put("big2", std::string(1000, 'y')));      // Triggers compaction
    ASSERT_OK(Put("bar", "v2"));                         // Goes to new log file

    Reopen(&options);
    ASSERT_EQ("v1", Get("foo"));
    ASSERT_EQ("v2", Get("bar"));
    ASSERT_EQ(std::string(10000000, 'x'), Get("big1"));
    ASSERT_EQ(std::string(1000, 'y'), Get("big2"));
  } while (ChangeOptions());
}